

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

Response *
webfront::http::Response::getStatusResponse(Response *__return_storage_ptr__,StatusCode code)

{
  ulong __val;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  StatusCode in_DX;
  undefined6 in_register_00000032;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->content)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content).field_2;
  (__return_storage_ptr__->content)._M_string_length = 0;
  (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->statusCode = code;
  toString_abi_cxx11_(&local_b0,(Response *)CONCAT62(in_register_00000032,code),in_DX);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_b0,0,0,"<html><head><title>",0x13);
  local_f0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar3) {
    local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_f0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,"</title></head>");
  paVar3 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar4) {
    local_d0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->content,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  uVar8 = 1;
  uVar9 = (uint)code;
  if (((9 < code) && (uVar8 = 2, 99 < code)) && (uVar8 = 3, 999 < uVar9)) {
    uVar8 = 5 - (uVar9 < 10000);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)uVar8,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70._M_dataplus._M_p,uVar8,uVar9);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"<body><h1>",10);
  local_50._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar4) {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," ");
  paVar4 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar5 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar5) {
    local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  toString_abi_cxx11_(&local_90,(Response *)(ulong)code,(StatusCode)local_b0._M_string_length);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar4) {
    uVar7 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar7 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_b0._M_string_length <= (ulong)uVar7) {
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_00111a30;
    }
  }
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_00111a30:
  local_f0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar5 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar5) {
    local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_f0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar2->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,"</h1></body></html>");
  local_d0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar5 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar5) {
    local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&__return_storage_ptr__->content,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __val = (__return_storage_ptr__->content)._M_string_length;
  uVar8 = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar9 = 4;
    do {
      uVar8 = uVar9;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00111bda;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00111bda;
      }
      if (uVar6 < 10000) goto LAB_00111bda;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar9 = uVar8 + 4;
    } while (bVar1);
    uVar8 = uVar8 + 1;
  }
LAB_00111bda:
  local_d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_d0,(ulong)uVar8,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,__val);
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>
              *)__return_storage_ptr__,(char (*) [15])"Content-Length",&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[13],char_const(&)[10]>
            ((vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>
              *)__return_storage_ptr__,(char (*) [13])"Content-Type",(char (*) [10])"text/html");
  return __return_storage_ptr__;
}

Assistant:

static Response getStatusResponse(StatusCode code) {
        Response response;
        response.statusCode = code;
        response.content = "<html><head><title>" + toString(code) + "</title></head>";
        response.content += "<body><h1>" + std::to_string(code) + " " + toString(code) + "</h1></body></html>";
        response.headers.emplace_back("Content-Length", std::to_string(response.content.size()));
        response.headers.emplace_back("Content-Type", "text/html");

        return response;
    }